

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_one.hpp
# Opt level: O0

iterator_range<burst::cache_iterator<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_cache_one_cpp:16:13),_double>,_std::_Fwd_list_const_iterator<double>,_boost::use_default,_boost::use_default>_>_>
* __thiscall
burst::
cache_one<boost::range_detail::transformed_range<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_3()::__0,std::forward_list<double,std::allocator<double>>const>>
          (iterator_range<burst::cache_iterator<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_cache_one_cpp:16:13),_double>,_std::_Fwd_list_const_iterator<double>,_boost::use_default,_boost::use_default>_>_>
           *__return_storage_ptr__,burst *this,
          transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_cache_one_cpp:16:13),_const_std::forward_list<double,_std::allocator<double>_>_>
          *range)

{
  cache_iterator<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_cache_one_cpp:16:13),_double>,_std::_Fwd_list_const_iterator<double>,_boost::use_default,_boost::use_default>_>
  *in_RCX;
  transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_cache_one_cpp:16:13),_double>,_std::_Fwd_list_const_iterator<double>,_boost::use_default,_boost::use_default>
  *iterator;
  transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_cache_one_cpp:16:13),_double>,_std::_Fwd_list_const_iterator<double>,_boost::use_default,_boost::use_default>
  *iterator_00;
  transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_cache_one_cpp:16:13),_double>,_std::_Fwd_list_const_iterator<double>,_boost::use_default,_boost::use_default>
  local_a8;
  type local_90;
  transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_cache_one_cpp:16:13),_double>,_std::_Fwd_list_const_iterator<double>,_boost::use_default,_boost::use_default>
  local_58;
  type local_40;
  burst *local_18;
  transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_cache_one_cpp:16:13),_const_std::forward_list<double,_std::allocator<double>_>_>
  *range_local;
  
  local_18 = this;
  range_local = (transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_cache_one_cpp:16:13),_const_std::forward_list<double,_std::allocator<double>_>_>
                 *)__return_storage_ptr__;
  std::
  begin<boost::range_detail::transformed_range<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_3()::__0,std::forward_list<double,std::allocator<double>>const>>
            (&local_58,
             (transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_cache_one_cpp:16:13),_const_std::forward_list<double,_std::allocator<double>_>_>
              *)this);
  make_cache_iterator<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_3()::__0,double>,std::_Fwd_list_const_iterator<double>,boost::use_default,boost::use_default>>
            (&local_40,(burst *)&local_58,iterator);
  std::
  end<boost::range_detail::transformed_range<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_3()::__0,std::forward_list<double,std::allocator<double>>const>>
            (&local_a8,
             (transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_range_cache_one_cpp:16:13),_const_std::forward_list<double,_std::allocator<double>_>_>
              *)local_18);
  make_cache_iterator<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_3()::__0,double>,std::_Fwd_list_const_iterator<double>,boost::use_default,boost::use_default>>
            (&local_90,(burst *)&local_a8,iterator_00);
  boost::
  make_iterator_range<burst::cache_iterator<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_3()::__0,double>,std::_Fwd_list_const_iterator<double>,boost::use_default,boost::use_default>>>
            (__return_storage_ptr__,(boost *)&local_40,&local_90,in_RCX);
  cache_iterator<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/range/cache_one.cpp:16:13),_double>,_std::_Fwd_list_const_iterator<double>,_boost::use_default,_boost::use_default>_>
  ::~cache_iterator(&local_90);
  boost::iterators::
  transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/range/cache_one.cpp:16:13),_double>,_std::_Fwd_list_const_iterator<double>,_boost::use_default,_boost::use_default>
  ::~transform_iterator(&local_a8);
  cache_iterator<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/range/cache_one.cpp:16:13),_double>,_std::_Fwd_list_const_iterator<double>,_boost::use_default,_boost::use_default>_>
  ::~cache_iterator(&local_40);
  boost::iterators::
  transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/range/cache_one.cpp:16:13),_double>,_std::_Fwd_list_const_iterator<double>,_boost::use_default,_boost::use_default>
  ::~transform_iterator(&local_58);
  return __return_storage_ptr__;
}

Assistant:

auto cache_one (const Range & range)
    {
        using std::begin;
        using std::end;
        return
            boost::make_iterator_range
            (
                make_cache_iterator(begin(range)),
                make_cache_iterator(end(range))
            );
    }